

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

bool has_phong_mat(aiScene *scene)

{
  ulong uVar1;
  bool bVar2;
  ai_real local_2c;
  
  bVar2 = scene->mNumMaterials != 0;
  if (bVar2) {
    local_2c = 0.0;
    aiGetMaterialFloatArray(*scene->mMaterials,"$mat.shininess",0,0,&local_2c,(uint *)0x0);
    if (local_2c <= 0.0) {
      uVar1 = 1;
      do {
        bVar2 = uVar1 < scene->mNumMaterials;
        if (!bVar2) {
          return bVar2;
        }
        local_2c = 0.0;
        aiGetMaterialFloatArray(scene->mMaterials[uVar1],"$mat.shininess",0,0,&local_2c,(uint *)0x0)
        ;
        uVar1 = uVar1 + 1;
      } while (local_2c <= 0.0);
    }
  }
  return bVar2;
}

Assistant:

bool has_phong_mat(const aiScene* scene)
{
    // just search for any material with a shininess exponent
    for (size_t i = 0; i < scene->mNumMaterials; ++i) {
        aiMaterial* mat = scene->mMaterials[i];
        float shininess = 0;
        mat->Get(AI_MATKEY_SHININESS, shininess);
        if (shininess > 0) {
            return true;
        }
    }
    return false;
}